

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primes.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int number;
  vector<int,_std::allocator<int>_> primes;
  string line;
  ifstream stream;
  uint local_25c;
  void *local_258;
  iterator iStack_250;
  int *local_248;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230 [16];
  long local_220 [65];
  
  std::ifstream::ifstream((istream *)local_220,argv[1],_S_in);
  local_238 = 0;
  local_230[0] = 0;
  local_248 = (int *)0x0;
  local_258 = (void *)0x0;
  iStack_250._M_current = (int *)0x0;
  local_25c = 2;
  local_240 = local_230;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_220[0] + -0x18) + (char)(istream *)local_220
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,(string *)&local_240,cVar2);
  } while (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0);
  uVar4 = (long)iStack_250._M_current - (long)local_258 >> 2;
  if (uVar4 < 1000) {
    do {
      if ((int)local_25c < 3) {
LAB_0010134a:
        if (iStack_250._M_current == local_248) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_258,iStack_250,(int *)&local_25c);
        }
        else {
          *iStack_250._M_current = local_25c;
          iStack_250._M_current = iStack_250._M_current + 1;
        }
      }
      else if ((local_25c & 1) != 0) {
        uVar1 = 3;
        do {
          uVar6 = uVar1;
          if (local_25c == uVar6) goto LAB_0010134a;
          uVar1 = uVar6 + 1;
        } while (local_25c % uVar6 != 0);
        if ((int)local_25c <= (int)uVar6) goto LAB_0010134a;
      }
      local_25c = local_25c + 1;
      uVar4 = (long)iStack_250._M_current - (long)local_258 >> 2;
    } while (uVar4 < 1000);
  }
  lVar5 = 0;
  do {
    lVar5 = lVar5 + 1;
  } while (uVar4 + (uVar4 == 0) != lVar5);
  std::ostream::_M_insert<long>((long)&std::cout);
  if (local_258 != (void *)0x0) {
    operator_delete(local_258);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
    string line;

    std::vector<int> primes;
    int number = 2;
    while (getline(stream, line)) {
    }

    while (primes.size() < 1000) {
        if (isPrime(number)) {
            primes.push_back(number);
        }
        number++;
    }

    long int sum = 0;
    for (int i = 0; i < primes.size(); i++) {
        sum += primes[i];
    }

    std::cout << sum;
    return 0;
}